

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Button.cxx
# Opt level: O0

int __thiscall Fl_Menu_Button::handle(Fl_Menu_Button *this,int e)

{
  uchar uVar1;
  byte bVar2;
  Fl_Boxtype FVar3;
  uint uVar4;
  int iVar5;
  Fl_Menu_Item *pFVar6;
  bool bVar7;
  int e_local;
  Fl_Menu_Button *this_local;
  
  pFVar6 = Fl_Menu_::menu(&this->super_Fl_Menu_);
  if ((pFVar6 == (Fl_Menu_Item *)0x0) ||
     (pFVar6 = Fl_Menu_::menu(&this->super_Fl_Menu_), pFVar6->text == (char *)0x0)) {
    this_local._4_4_ = 0;
  }
  else {
    switch(e) {
    case 1:
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      if (FVar3 == FL_NO_BOX) {
        iVar5 = Fl::event_button();
        if (iVar5 != 3) {
          return 0;
        }
      }
      else {
        uVar1 = Fl_Widget::type((Fl_Widget *)this);
        if (uVar1 != '\0') {
          bVar2 = Fl_Widget::type((Fl_Widget *)this);
          iVar5 = Fl::event_button();
          if (((uint)bVar2 & 1 << ((char)iVar5 - 1U & 0x1f)) == 0) {
            return 0;
          }
        }
      }
      iVar5 = Fl::visible_focus();
      if (iVar5 != 0) {
        Fl::focus((Fl_Widget *)this);
      }
      popup(this);
      this_local._4_4_ = 1;
      break;
    case 3:
    case 4:
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      bVar7 = false;
      if (FVar3 != FL_NO_BOX) {
        uVar1 = Fl_Widget::type((Fl_Widget *)this);
        bVar7 = uVar1 == '\0';
      }
      this_local._4_4_ = (uint)bVar7;
      break;
    case 6:
    case 7:
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      if ((FVar3 != FL_NO_BOX) && (iVar5 = Fl::visible_focus(), iVar5 != 0)) {
        Fl_Widget::redraw((Fl_Widget *)this);
        return 1;
      }
    default:
      this_local._4_4_ = 0;
      break;
    case 8:
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      if (FVar3 == FL_NO_BOX) {
        this_local._4_4_ = 0;
      }
      else {
        iVar5 = Fl::event_key();
        if ((iVar5 == 0x20) && (uVar4 = Fl::event_state(), (uVar4 & 0x4d0000) == 0)) {
          popup(this);
          this_local._4_4_ = 1;
        }
        else {
          this_local._4_4_ = 0;
        }
      }
      break;
    case 0xc:
      iVar5 = Fl_Widget::test_shortcut((Fl_Widget *)this);
      if (iVar5 == 0) {
        pFVar6 = Fl_Menu_::test_shortcut(&this->super_Fl_Menu_);
        this_local._4_4_ = (uint)(pFVar6 != (Fl_Menu_Item *)0x0);
      }
      else {
        popup(this);
        this_local._4_4_ = 1;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Menu_Button::handle(int e) {
  if (!menu() || !menu()->text) return 0;
  switch (e) {
  case FL_ENTER: /* FALLTHROUGH */
  case FL_LEAVE:
    return (box() && !type()) ? 1 : 0;
  case FL_PUSH:
    if (!box()) {
      if (Fl::event_button() != 3) return 0;
    } else if (type()) {
      if (!(type() & (1 << (Fl::event_button()-1)))) return 0;
    }
    if (Fl::visible_focus()) Fl::focus(this);
    popup();
    return 1;
  case FL_KEYBOARD:
    if (!box()) return 0;
    if (Fl::event_key() == ' ' &&
        !(Fl::event_state() & (FL_SHIFT | FL_CTRL | FL_ALT | FL_META))) {
      popup();
      return 1;
    } else return 0;
  case FL_SHORTCUT:
    if (Fl_Widget::test_shortcut()) {popup(); return 1;}
    return test_shortcut() != 0;
  case FL_FOCUS: /* FALLTHROUGH */
  case FL_UNFOCUS:
    if (box() && Fl::visible_focus()) {
      redraw();
      return 1;
    }
  default:
    return 0;
  }
}